

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

shared_ptr<mocker::nasm::MemoryAddr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::buildMemAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Reg> *addr)

{
  shared_ptr<mocker::ir::Reg> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::nasm::MemoryAddr> sVar1;
  shared_ptr<mocker::ir::Addr> local_40;
  undefined1 local_30 [24];
  shared_ptr<mocker::ir::Reg> *addr_local;
  FuncSelectionContext *this_local;
  
  addr_local = addr;
  this_local = this;
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_40,in_RDX);
  getIrAddr((FuncSelectionContext *)local_30,(shared_ptr<mocker::ir::Addr> *)addr);
  std::make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>>
            ((shared_ptr<mocker::nasm::Addr> *)this);
  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_30);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_40);
  sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::MemoryAddr>)
         sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::MemoryAddr>
  buildMemAddr(const std::shared_ptr<ir::Reg> &addr) const {
    // TODO
    return std::make_shared<nasm::MemoryAddr>(getIrAddr(addr));
  }